

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O0

bool __thiscall
aiMetadata::Get<aiVector3t<float>>(aiMetadata *this,aiString *key,aiVector3t<float> *value)

{
  bool bVar1;
  uint local_2c;
  uint i;
  aiVector3t<float> *value_local;
  aiString *key_local;
  aiMetadata *this_local;
  
  local_2c = 0;
  while( true ) {
    if (this->mNumProperties <= local_2c) {
      return false;
    }
    bVar1 = aiString::operator==(this->mKeys + local_2c,key);
    if (bVar1) break;
    local_2c = local_2c + 1;
  }
  bVar1 = Get<aiVector3t<float>>(this,local_2c,value);
  return bVar1;
}

Assistant:

inline 
    bool Get( const aiString& key, T& value ) const {
        // Search for the given key
        for ( unsigned int i = 0; i < mNumProperties; ++i ) {
            if ( mKeys[ i ] == key ) {
                return Get( i, value );
            }
        }
        return false;
    }